

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCursorRestore(BtCursor *pCur,int *pDifferentRow)

{
  int local_28;
  int rc;
  int *pDifferentRow_local;
  BtCursor *pCur_local;
  
  if (pCur->eState < 3) {
    local_28 = 0;
  }
  else {
    local_28 = btreeRestoreCursorPosition(pCur);
  }
  if (local_28 == 0) {
    if (pCur->eState == '\0') {
      *pDifferentRow = 0;
    }
    else {
      *pDifferentRow = 1;
    }
    pCur_local._4_4_ = 0;
  }
  else {
    *pDifferentRow = 1;
    pCur_local._4_4_ = local_28;
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCursorRestore(BtCursor *pCur, int *pDifferentRow){
  int rc;

  assert( pCur!=0 );
  assert( pCur->eState!=CURSOR_VALID );
  rc = restoreCursorPosition(pCur);
  if( rc ){
    *pDifferentRow = 1;
    return rc;
  }
  if( pCur->eState!=CURSOR_VALID ){
    *pDifferentRow = 1;
  }else{
    *pDifferentRow = 0;
  }
  return SQLITE_OK;
}